

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O3

bool __thiscall ON_WindowsBitmap::IsValid(ON_WindowsBitmap *this,ON_TextLog *text_log)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((this->m_bmi != (ON_WindowsBITMAPINFO *)0x0) && (bVar2 = false, this->m_bits != (uchar *)0x0))
  {
    iVar1 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x18])
                      (this);
    if (iVar1 < 1) {
      bVar2 = false;
    }
    else {
      iVar1 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object
                [0x19])(this);
      bVar2 = 0 < iVar1;
    }
  }
  if ((text_log != (ON_TextLog *)0x0) && (bVar2 == false)) {
    ON_TextLog::Print(text_log,"ON_WindowsBitmap is not valid\n");
  }
  return bVar2;
}

Assistant:

bool ON_WindowsBitmap::IsValid( ON_TextLog* text_log ) const
{
  bool rc 
    = ( m_bmi != nullptr && m_bits != nullptr && Width() > 0 && Height() > 0) 
    ? true
    : false;

  if ( !rc && 0 != text_log )
  {
    // TODO:  add a detailed diagnostic message
    text_log->Print("ON_WindowsBitmap is not valid\n");
  }
  return rc;
}